

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BalanceFunction.cpp
# Opt level: O3

void __thiscall
BalanceFunction::BalanceFunction
          (BalanceFunction *this,ParameterReader *paraRdr,string *path,
          shared_ptr<RandomUtil::Random> *ran_gen)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  value_type_conflict local_150;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_148;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_140;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_138;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_130;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_128;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_120;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,&paraRdr->names);
  std::vector<double,_std::allocator<double>_>::vector(&(this->paraRdr_).values,&paraRdr->values);
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path_,pcVar1,pcVar1 + path->_M_string_length);
  (this->ran_gen_ptr).super___weak_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ran_gen_ptr).super___weak_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pretty_ostream::pretty_ostream(&this->messager);
  local_118 = &this->C_abarbbar;
  local_128 = &this->C_abbar;
  local_120 = &this->C_abarb;
  local_130 = &this->C_mixed_ab;
  local_138 = &this->C_mixed_abarbbar;
  local_148 = &this->C_mixed_abbar;
  local_140 = &this->C_mixed_abarb;
  memset(&this->C_ab,0,0xc0);
  (this->ran_gen_ptr).super___weak_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ran_gen->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ran_gen_ptr).super___weak_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(ran_gen->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"particle_alpha","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_50);
  this->particle_monval_a = (int)dVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"particle_beta","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_70);
  iVar2 = (int)dVar5;
  this->particle_monval_b = iVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
    iVar2 = this->particle_monval_b;
  }
  this->same_species = iVar2 + this->particle_monval_a == 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BpT_min","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_90);
  this->BpT_min = dVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"BpT_max","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_b0);
  this->BpT_max = dVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Bnpts","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_d0);
  this->Bnpts = (int)dVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Brap_max","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_f0);
  this->Brap_max = dVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
    dVar5 = this->Brap_max;
  }
  dVar5 = ABS(dVar5);
  dVar6 = (dVar5 + dVar5) / (double)(this->Bnpts + -1);
  this->drap = dVar6;
  this->Brap_min = dVar6 * -0.5 - dVar5;
  this->Bnphi = 0x14;
  this->dphi = 0.3141592653589793;
  this->Bphi_min = -1.5707963267948966;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"rap_type","");
  dVar5 = ParameterReader::getVal(&this->paraRdr_,&local_110);
  this->rap_type_ = (int)dVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->C_ab,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_118,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_120,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_128,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_130,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_138,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_140,(long)this->Bnpts);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_148,(long)this->Bnpts);
  if (0 < this->Bnpts) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_ab).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_abarbbar).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_abarb).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_abbar).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_mixed_ab).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_mixed_abarbbar).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_mixed_abarb).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      local_150 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->C_mixed_abbar).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),(long)this->Bnphi,&local_150);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < this->Bnpts);
  }
  this->N_b = 0;
  this->N_bbar = 0;
  return;
}

Assistant:

BalanceFunction::BalanceFunction(
    const ParameterReader& paraRdr, const std::string path,
    std::shared_ptr<RandomUtil::Random> ran_gen)
    : paraRdr_(paraRdr), path_(path) {
    ran_gen_ptr = ran_gen;

    particle_monval_a = paraRdr_.getVal("particle_alpha");
    particle_monval_b = paraRdr_.getVal("particle_beta");
    if (particle_monval_a == -particle_monval_b)
        same_species = true;
    else
        same_species = false;

    BpT_min = paraRdr_.getVal("BpT_min");
    BpT_max = paraRdr_.getVal("BpT_max");
    Bnpts = paraRdr_.getVal("Bnpts");
    Brap_max = paraRdr_.getVal("Brap_max");
    drap = 2. * std::abs(Brap_max) / (Bnpts - 1);
    Brap_min = -std::abs(Brap_max) - 0.5 * drap;
    Bnphi = 20;
    dphi = 2. * M_PI / Bnphi;
    Bphi_min = -M_PI / 2.;

    rap_type_ = paraRdr_.getVal("rap_type");

    C_ab.resize(Bnpts);
    C_abarbbar.resize(Bnpts);
    C_abarb.resize(Bnpts);
    C_abbar.resize(Bnpts);
    C_mixed_ab.resize(Bnpts);
    C_mixed_abarbbar.resize(Bnpts);
    C_mixed_abarb.resize(Bnpts);
    C_mixed_abbar.resize(Bnpts);
    for (int i = 0; i < Bnpts; i++) {
        C_ab[i].assign(Bnphi, 0.);
        C_abarbbar[i].assign(Bnphi, 0.);
        C_abarb[i].assign(Bnphi, 0.);
        C_abbar[i].assign(Bnphi, 0.);
        C_mixed_ab[i].assign(Bnphi, 0.);
        C_mixed_abarbbar[i].assign(Bnphi, 0.);
        C_mixed_abarb[i].assign(Bnphi, 0.);
        C_mixed_abbar[i].assign(Bnphi, 0.);
    }

    N_b = 0;
    N_bbar = 0;
}